

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

int __thiscall
kj::_::BTreeImpl::verify
          (BTreeImpl *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  EVP_PKEY_CTX *pEVar1;
  Fault f_1;
  Fault local_20;
  FunctionParam<bool_(unsigned_int,_unsigned_int)> local_18;
  
  local_18.space[0] = sig;
  local_18.space[1] = (void *)siglen;
  pEVar1 = (EVP_PKEY_CTX *)verifyNode(this,(size_t)ctx,&local_18,0,this->height,(MaybeUint)0x0);
  if (pEVar1 == ctx) {
    return (int)pEVar1;
  }
  Debug::Fault::Fault(&local_20,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                      ,0xcd,FAILED,"verifyNode(size, f, 0, height, nullptr) == size","");
  Debug::Fault::fatal(&local_20);
}

Assistant:

void BTreeImpl::verify(size_t size, FunctionParam<bool(uint, uint)> f) {
  KJ_ASSERT(verifyNode(size, f, 0, height, nullptr) == size);
}